

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

_Bool M680X_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  _Bool _Var1;
  MCInst *in_RCX;
  m680x_info *in_RDX;
  MCInst *in_RSI;
  m680x_info *in_RDI;
  undefined2 *in_R8;
  m680x_info *info;
  cs_struct *handle;
  e_cpu_type cpu_type;
  uint insn_size;
  uint8_t *in_stack_ffffffffffffffa8;
  undefined8 uVar2;
  int local_40;
  uint local_3c;
  uint16_t address_00;
  _Bool local_1;
  
  local_3c = 0;
  local_40 = 0;
  uVar2._0_4_ = in_RDI->cpu_type;
  uVar2._4_1_ = (in_RDI->m680x).flags;
  uVar2._5_1_ = (in_RDI->m680x).op_count;
  uVar2._6_2_ = *(undefined2 *)&(in_RDI->m680x).field_0x2;
  MCInst_clear(in_RCX);
  address_00 = (uint16_t)((ulong)in_RCX >> 0x30);
  if (((ulong)in_RDI->code & 0x800000000) == 0) {
    if (((ulong)in_RDI->code & 0x1000000000) == 0) {
      if (((ulong)in_RDI->code & 0x2000000000) == 0) {
        if (((ulong)in_RDI->code & 0x4000000000) == 0) {
          if (((ulong)in_RDI->code & 0x40000000000) == 0) {
            if (((ulong)in_RDI->code & 0x8000000000) == 0) {
              if (((ulong)in_RDI->code & 0x200000000) == 0) {
                if (((ulong)in_RDI->code & 0x400000000) == 0) {
                  if (((ulong)in_RDI->code & 0x10000000000) == 0) {
                    if (((ulong)in_RDI->code & 0x20000000000) != 0) {
                      local_40 = 9;
                    }
                  }
                  else {
                    local_40 = 8;
                  }
                }
                else {
                  local_40 = 2;
                }
              }
              else {
                local_40 = 1;
              }
            }
            else {
              local_40 = 7;
            }
          }
          else {
            local_40 = 10;
          }
        }
        else {
          local_40 = 6;
        }
      }
      else {
        local_40 = 5;
      }
    }
    else {
      local_40 = 4;
    }
  }
  else {
    local_40 = 3;
  }
  if ((local_40 != 0) &&
     (_Var1 = m680x_setup_internals
                        (in_RDI,(e_cpu_type)((ulong)uVar2 >> 0x20),(uint16_t)((ulong)uVar2 >> 0x10),
                         in_stack_ffffffffffffffa8,0), _Var1)) {
    local_3c = m680x_disassemble(in_RSI,in_RDX,address_00);
  }
  if (local_3c == 0) {
    *in_R8 = 1;
    local_1 = false;
  }
  else if (in_RDX < (m680x_info *)(ulong)local_3c) {
    *in_R8 = (short)in_RDX;
    local_1 = false;
  }
  else {
    *in_R8 = (short)local_3c;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool M680X_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned int insn_size = 0;
	e_cpu_type cpu_type = M680X_CPU_TYPE_INVALID; // No default CPU type
	cs_struct *handle = (cs_struct *)ud;
	m680x_info *info = (m680x_info *)handle->printer_info;

	MCInst_clear(MI);

	if (handle->mode & CS_MODE_M680X_6800)
		cpu_type = M680X_CPU_TYPE_6800;

	else if (handle->mode & CS_MODE_M680X_6801)
		cpu_type = M680X_CPU_TYPE_6801;

	else if (handle->mode & CS_MODE_M680X_6805)
		cpu_type = M680X_CPU_TYPE_6805;

	else if (handle->mode & CS_MODE_M680X_6808)
		cpu_type = M680X_CPU_TYPE_6808;

	else if (handle->mode & CS_MODE_M680X_HCS08)
		cpu_type = M680X_CPU_TYPE_HCS08;

	else if (handle->mode & CS_MODE_M680X_6809)
		cpu_type = M680X_CPU_TYPE_6809;

	else if (handle->mode & CS_MODE_M680X_6301)
		cpu_type = M680X_CPU_TYPE_6301;

	else if (handle->mode & CS_MODE_M680X_6309)
		cpu_type = M680X_CPU_TYPE_6309;

	else if (handle->mode & CS_MODE_M680X_6811)
		cpu_type = M680X_CPU_TYPE_6811;

	else if (handle->mode & CS_MODE_M680X_CPU12)
		cpu_type = M680X_CPU_TYPE_CPU12;

	if (cpu_type != M680X_CPU_TYPE_INVALID &&
		m680x_setup_internals(info, cpu_type, (uint16_t)address, code,
			code_len))
		insn_size = m680x_disassemble(MI, info, (uint16_t)address);

	if (insn_size == 0) {
		*size = 1;
		return false;
	}

	// Make sure we always stay within range
	if (insn_size > code_len) {
		*size = (uint16_t)code_len;
		return false;
	}
	else
		*size = (uint16_t)insn_size;

	return true;
}